

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

Ivy_Man_t * Ivy_FraigPerform(Ivy_Man_t *pManAig,Ivy_FraigParams_t *pParams)

{
  Ivy_Man_t *pIVar1;
  abctime aVar2;
  Ivy_FraigMan_t *p;
  abctime aVar3;
  
  if (pManAig->nObjs[6] + pManAig->nObjs[5] == 0) {
    pIVar1 = Ivy_ManDup(pManAig);
    return pIVar1;
  }
  aVar2 = Abc_Clock();
  if (pManAig->nObjs[4] == 0) {
    p = Ivy_FraigStart(pManAig,pParams);
    Ivy_FraigSimulate(p);
    Ivy_FraigSweep(p);
    pIVar1 = p->pManFraig;
    aVar3 = Abc_Clock();
    p->timeTotal = aVar3 - aVar2;
    Ivy_FraigStop(p);
    return pIVar1;
  }
  __assert_fail("Ivy_ManLatchNum(pManAig) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                ,0x1cb,"Ivy_Man_t *Ivy_FraigPerform(Ivy_Man_t *, Ivy_FraigParams_t *)");
}

Assistant:

Ivy_Man_t * Ivy_FraigPerform( Ivy_Man_t * pManAig, Ivy_FraigParams_t * pParams )
{
    Ivy_FraigMan_t * p;
    Ivy_Man_t * pManAigNew;
    abctime clk;
    if ( Ivy_ManNodeNum(pManAig) == 0 )
        return Ivy_ManDup(pManAig);
clk = Abc_Clock();
    assert( Ivy_ManLatchNum(pManAig) == 0 );
    p = Ivy_FraigStart( pManAig, pParams );
    Ivy_FraigSimulate( p );
    Ivy_FraigSweep( p );
    pManAigNew = p->pManFraig;
p->timeTotal = Abc_Clock() - clk;
    Ivy_FraigStop( p );
    return pManAigNew;
}